

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O1

void CheckIMG(TidyDocImpl *doc,Node *node)

{
  AttVal *pAVar1;
  ctmbstr value;
  AttVal *pAVar2;
  AttVal *pAVar3;
  AttVal *pAVar4;
  AttVal *pAVar5;
  AttVal *pAVar6;
  AttVal *pAVar7;
  
  pAVar2 = prvTidyAttrGetById(node,TidyAttr_ALT);
  pAVar3 = prvTidyAttrGetById(node,TidyAttr_SRC);
  pAVar4 = prvTidyAttrGetById(node,TidyAttr_USEMAP);
  pAVar5 = prvTidyAttrGetById(node,TidyAttr_ISMAP);
  pAVar6 = prvTidyAttrGetById(node,TidyAttr_DATAFLD);
  pAVar7 = node->attributes;
  while (pAVar7 != (AttVal *)0x0) {
    pAVar1 = pAVar7->next;
    prvTidyCheckAttribute(doc,node,pAVar7);
    pAVar7 = pAVar1;
  }
  if (pAVar2 == (AttVal *)0x0) {
    value = (doc->config).value[2].p;
    if ((doc->config).value[1].v == 0 && value == (ctmbstr)0x0) {
      *(byte *)&doc->badAccess = (byte)doc->badAccess | 1;
      prvTidyReportMissingAttr(doc,node,"alt");
    }
    if (value != (ctmbstr)0x0) {
      pAVar7 = prvTidyAddAttribute(doc,node,"alt",value);
      prvTidyReportAttrError(doc,node,pAVar7,0x244);
    }
  }
  if (pAVar3 == (AttVal *)0x0 && pAVar6 == (AttVal *)0x0) {
    prvTidyReportMissingAttr(doc,node,"src");
  }
  if ((((doc->config).value[1].v == 0) && (pAVar5 != (AttVal *)0x0)) && (pAVar4 == (AttVal *)0x0)) {
    prvTidyReportAttrError(doc,node,(AttVal *)0x0,0x25a);
    *(byte *)&doc->badAccess = (byte)doc->badAccess | 8;
  }
  return;
}

Assistant:

void CheckIMG( TidyDocImpl* doc, Node *node )
{
    Bool HasAlt = TY_(AttrGetById)(node, TidyAttr_ALT) != NULL;
    Bool HasSrc = TY_(AttrGetById)(node, TidyAttr_SRC) != NULL;
    Bool HasUseMap = TY_(AttrGetById)(node, TidyAttr_USEMAP) != NULL;
    Bool HasIsMap = TY_(AttrGetById)(node, TidyAttr_ISMAP) != NULL;
    Bool HasDataFld = TY_(AttrGetById)(node, TidyAttr_DATAFLD) != NULL;

    TY_(CheckAttributes)(doc, node);

    if ( !HasAlt )
    {
        ctmbstr alttext = cfgStr(doc, TidyAltText);
        if ( ( cfg(doc, TidyAccessibilityCheckLevel) == 0 ) && ( !alttext ) )
        {
            doc->badAccess |= BA_MISSING_IMAGE_ALT;
            TY_(ReportMissingAttr)( doc, node, "alt" );
        }

        if ( alttext ) {
            AttVal *attval = TY_(AddAttribute)( doc, node, "alt", alttext );
            TY_(ReportAttrError)( doc, node, attval, INSERTING_AUTO_ATTRIBUTE);
        }
    }

    if ( !HasSrc && !HasDataFld )
        TY_(ReportMissingAttr)( doc, node, "src" );

    if ( cfg(doc, TidyAccessibilityCheckLevel) == 0 )
    {
        if ( HasIsMap && !HasUseMap )
        {
            TY_(ReportAttrError)( doc, node, NULL, MISSING_IMAGEMAP);
            doc->badAccess |= BA_MISSING_IMAGE_MAP;
        }
    }
}